

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bsreadlnsa(bstring r,bStream *s,bstring term)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  size_t sVar4;
  undefined1 local_90 [8];
  charField cf;
  tagbstring x;
  uchar *b;
  int rlo;
  int ret;
  int l;
  int i;
  bstring term_local;
  bStream *s_local;
  bstring r_local;
  
  if (((((s == (bStream *)0x0) || (s->buff == (bstring)0x0)) || (r == (bstring)0x0)) ||
      ((term == (bstring)0x0 || (term->data == (uchar *)0x0)))) ||
     ((r->mlen < 1 || ((r->slen < 0 || (r->mlen < r->slen)))))) {
    r_local._4_4_ = -1;
  }
  else if (term->slen == 1) {
    r_local._4_4_ = bsreadlna(r,s,*term->data);
  }
  else if ((term->slen < 1) || (iVar1 = buildCharField((charField *)local_90,term), iVar1 != 0)) {
    r_local._4_4_ = -1;
  }
  else {
    iVar1 = s->buff->slen;
    iVar2 = balloc(s->buff,s->maxBuffSz + 1);
    if (iVar2 == 0) {
      puVar3 = s->buff->data;
      puVar3[iVar1] = *term->data;
      ret = 0;
      while ((cf.content[(long)((int)(uint)puVar3[ret] >> 5) + -1] & 1L << (puVar3[ret] & 0x1f)) ==
             0) {
        ret = ret + 1;
      }
      if (ret < iVar1) {
        cf.content[7]._4_4_ = ret + 1;
        iVar2 = bconcat(r,(bstring)(cf.content + 7));
        s->buff->slen = iVar1;
        if (iVar2 == 0) {
          bdelete(s->buff,0,ret + 1);
        }
        r_local._4_4_ = 0;
      }
      else {
        iVar2 = r->slen;
        cf.content[7]._4_4_ = iVar1;
        iVar1 = bconcat(r,(bstring)(cf.content + 7));
        if (iVar1 == 0) {
          while (iVar1 = balloc(r,r->slen + s->maxBuffSz + 1), iVar1 == 0) {
            puVar3 = r->data + r->slen;
            sVar4 = (*s->readFnPtr)(puVar3,1,(long)s->maxBuffSz,s->parm);
            iVar1 = (int)sVar4;
            if (iVar1 < 1) {
              r->data[r->slen] = '\0';
              s->buff->slen = 0;
              s->isEOF = 1;
              return -(uint)(r->slen == iVar2);
            }
            puVar3[iVar1] = *term->data;
            ret = 0;
            while ((cf.content[(long)((int)(uint)puVar3[ret] >> 5) + -1] &
                   1L << (puVar3[ret] & 0x1f)) == 0) {
              ret = ret + 1;
            }
            if (ret < iVar1) {
              iVar2 = ret + 1;
              r->slen = iVar2 + r->slen;
              s->buff->slen = iVar1 - iVar2;
              memcpy(s->buff->data,puVar3 + iVar2,(long)(iVar1 - iVar2));
              r->data[r->slen] = '\0';
              return 0;
            }
            r->slen = iVar1 + r->slen;
          }
          r_local._4_4_ = -1;
        }
        else {
          r_local._4_4_ = -1;
        }
      }
    }
    else {
      r_local._4_4_ = -1;
    }
  }
  return r_local._4_4_;
}

Assistant:

int bsreadlnsa (bstring r, struct bStream * s, const bstring term) {
int i, l, ret, rlo;
unsigned char * b;
struct tagbstring x;
struct charField cf;

	if (s == NULL || s->buff == NULL || r == NULL || term == NULL ||
	    term->data == NULL || r->mlen <= 0 || r->slen < 0 ||
	    r->mlen < r->slen) return BSTR_ERR;
	if (term->slen == 1) return bsreadlna (r, s, term->data[0]);
	if (term->slen < 1 || buildCharField (&cf, term)) return BSTR_ERR;

	l = s->buff->slen;
	if (BSTR_OK != balloc (s->buff, s->maxBuffSz + 1)) return BSTR_ERR;
	b = (unsigned char *) s->buff->data;
	x.data = b;

	/* First check if the current buffer holds the terminator */
	b[l] = term->data[0]; /* Set sentinel */
	for (i=0; !testInCharField (&cf, b[i]); i++) ;
	if (i < l) {
		x.slen = i + 1;
		ret = bconcat (r, &x);
		s->buff->slen = l;
		if (BSTR_OK == ret) bdelete (s->buff, 0, i + 1);
		return 0;
	}

	rlo = r->slen;

	/* If not then just concatenate the entire buffer to the output */
	x.slen = l;
	if (BSTR_OK != bconcat (r, &x)) return BSTR_ERR;

	/* Perform direct in-place reads into the destination to allow for
	   the minimum of data-copies */
	for (;;) {
		if (BSTR_OK != balloc (r, r->slen + s->maxBuffSz + 1)) return BSTR_ERR;
		b = (unsigned char *) (r->data + r->slen);
		l = (int) s->readFnPtr (b, 1, s->maxBuffSz, s->parm);
		if (l <= 0) {
			r->data[r->slen] = (unsigned char) '\0';
			s->buff->slen = 0;
			s->isEOF = 1;
			/* If nothing was read return with an error message */
			return BSTR_ERR & -(r->slen == rlo);
		}

		b[l] = term->data[0]; /* Set sentinel */
		for (i=0; !testInCharField (&cf, b[i]); i++) ;
		if (i < l) break;
		r->slen += l;
	}

	/* Terminator found, push over-read back to buffer */
	i++;
	r->slen += i;
	s->buff->slen = l - i;
	bstr__memcpy (s->buff->data, b + i, l - i);
	r->data[r->slen] = (unsigned char) '\0';
	return BSTR_OK;
}